

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseExceptModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  Enum EVar2;
  Token local_a8;
  Location local_58;
  _Head_base<0UL,_wabt::ExceptionModuleField_*,_false> local_38;
  ExceptionModuleField *local_30;
  unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_> field;
  
  RVar1 = Expect(this,Lpar);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    GetToken(&local_a8,this);
    local_58.field_1.field_1.offset = local_a8.loc.field_1.field_1.offset;
    local_58.field_1._8_8_ = local_a8.loc.field_1._8_8_;
    local_58.filename.data_ = local_a8.loc.filename.data_;
    local_58.filename.size_ = local_a8.loc.filename.size_;
    Token::~Token(&local_a8);
    MakeUnique<wabt::ExceptionModuleField,wabt::Location>((wabt *)&local_30,&local_58);
    RVar1 = Expect(this,Except);
    EVar2 = Error;
    if (RVar1.enum_ != Error) {
      ParseBindVarOpt(this,&(local_30->except).name);
      RVar1 = ParseValueTypeList(this,&(local_30->except).sig);
      if (RVar1.enum_ != Error) {
        RVar1 = Expect(this,Rpar);
        if (RVar1.enum_ != Error) {
          local_38._M_head_impl = local_30;
          local_30 = (ExceptionModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
                                      *)&local_38);
          if (local_38._M_head_impl != (ExceptionModuleField *)0x0) {
            (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_38._M_head_impl = (ExceptionModuleField *)0x0;
          EVar2 = Ok;
        }
      }
    }
    if (local_30 != (ExceptionModuleField *)0x0) {
      (*(local_30->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
        _vptr_ModuleField[1])();
    }
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseExceptModuleField(Module* module) {
  WABT_TRACE(ParseExceptModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<ExceptionModuleField>(GetLocation());
  EXPECT(Except);
  ParseBindVarOpt(&field->except.name);
  CHECK_RESULT(ParseValueTypeList(&field->except.sig));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}